

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
     grow(buffer<unsigned_int> *buf,size_t size)

{
  allocator<unsigned_int> *b;
  allocator<unsigned_int> *this;
  allocator<unsigned_int> *paVar1;
  allocator<unsigned_int> *n;
  buffer<unsigned_int> *pbVar2;
  uint *buf_data;
  size_t sVar3;
  allocator<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> *self;
  uint *p;
  allocator<unsigned_int> *in_stack_ffffffffffffffb0;
  buffer<unsigned_int> *this_00;
  
  detail::abort_fuzzing_if(false);
  b = (allocator<unsigned_int> *)
      std::allocator_traits<fmt::v11::detail::allocator<unsigned_int>_>::max_size
                (in_stack_ffffffffffffffb0);
  this = (allocator<unsigned_int> *)detail::buffer<unsigned_int>::capacity(in_RDI);
  paVar1 = this + ((ulong)this >> 1);
  n = in_RSI;
  if ((in_RSI <= paVar1) && (n = paVar1, b < paVar1)) {
    n = (allocator<unsigned_int> *)max_of<unsigned_long>((unsigned_long)in_RSI,(unsigned_long)b);
  }
  pbVar2 = (buffer<unsigned_int> *)detail::buffer<unsigned_int>::data(in_RDI);
  buf_data = detail::allocator<unsigned_int>::allocate(this,(size_t)n);
  detail::buffer<unsigned_int>::size(in_RDI);
  p = buf_data;
  this_00 = pbVar2;
  sVar3 = detail::buffer<unsigned_int>::size(in_RDI);
  memcpy(p,this_00,sVar3 << 2);
  detail::buffer<unsigned_int>::set(in_RDI,buf_data,(size_t)n);
  if (pbVar2 != in_RDI + 1) {
    detail::allocator<unsigned_int>::deallocate((allocator<unsigned_int> *)this_00,p,0x2b7d29);
  }
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }